

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

Vec_Int_t * Cba_NtkCollectInFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  byte bVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  void *__s;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  uVar11 = (p->vFonObj).nSize;
  iVar8 = (((int)uVar11 >> 5) + 1) - (uint)((uVar11 & 0x1f) == 0);
  if (iVar8 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar8 * 4);
  }
  uVar11 = iVar8 * 0x20;
  memset(__s,0,(long)iVar8 << 2);
  iVar2 = vObjs->nSize;
  if (0 < (long)iVar2) {
    piVar7 = vObjs->pArray;
    lVar10 = 0;
    do {
      uVar13 = piVar7[lVar10];
      if ((int)uVar13 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x154,"int Cba_ObjFin0(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFin0).nSize <= (int)uVar13) goto LAB_00338100;
      iVar3 = (p->vObjFin0).nSize;
      if (iVar3 <= (int)(uVar13 + 1)) goto LAB_00338100;
      piVar5 = (p->vObjFin0).pArray;
      uVar4 = piVar5[uVar13];
      uVar12 = (ulong)uVar4;
      while ((int)uVar12 < piVar5[(ulong)uVar13 + 1]) {
        if ((int)uVar4 < 1) {
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        if ((p->vFinFon).nSize <= (int)uVar12) goto LAB_00338100;
        uVar9 = (p->vFinFon).pArray[uVar12];
        if (0 < (int)uVar9) {
          if ((int)uVar11 <= (int)uVar9) goto LAB_0033811f;
          puVar1 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
        }
        uVar12 = uVar12 + 1;
        if (iVar3 <= (int)(uVar13 + 1)) goto LAB_00338100;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  iVar2 = vObjs->nSize;
  if (0 < (long)iVar2) {
    piVar7 = vObjs->pArray;
    lVar10 = 0;
    do {
      uVar13 = piVar7[lVar10];
      if ((int)uVar13 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFon0).nSize <= (int)uVar13) {
LAB_00338100:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (p->vObjFon0).nSize;
      if (iVar3 <= (int)(uVar13 + 1)) goto LAB_00338100;
      piVar5 = (p->vObjFon0).pArray;
      uVar4 = piVar5[uVar13];
      uVar9 = uVar4;
      while ((int)uVar9 < piVar5[(ulong)uVar13 + 1]) {
        if (((int)uVar4 < 0) || ((int)uVar11 <= (int)uVar9)) {
LAB_0033811f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        bVar6 = (byte)uVar9 & 0x1f;
        puVar1 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
        *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        uVar9 = uVar9 + 1;
        if (iVar3 <= (int)(uVar13 + 1)) goto LAB_00338100;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  if (0 < iVar8) {
    uVar13 = 1;
    if (1 < (int)uVar11) {
      uVar13 = uVar11;
    }
    uVar11 = 0;
    do {
      if ((*(uint *)((long)__s + (ulong)(uVar11 >> 5) * 4) >> (uVar11 & 0x1f) & 1) != 0) {
        Vec_IntPush(p_00,uVar11);
      }
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectInFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon, Entry;
    // mark fanin fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            if ( iFon > 0 )
                Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // unmark internal fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            Vec_BitWriteEntry( vVisFons, iFon, 0 );
    // collect fons
    Vec_BitForEachEntry( vVisFons, Entry, iFon )
        if ( Entry )
            Vec_IntPush( vFons, iFon );
    Vec_BitFree( vVisFons );
    return vFons;
}